

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

string * tchecker::to_string(string *__return_storage_ptr__,clock_constraint_container_t *c,
                            clock_index_t *index)

{
  stringstream ss;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>_>
  local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1b0._begin._M_current =
       (c->
       super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_1b0._end._M_current =
       (c->
       super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  output_clock_constraints<__gnu_cxx::__normal_iterator<tchecker::clock_constraint_t_const*,std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>>
            (local_190,&local_1b0,index);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tchecker::clock_constraint_container_t const & c, tchecker::clock_index_t const & index)
{
  std::stringstream ss;
  tchecker::output_clock_constraints(ss, tchecker::make_range(c.begin(), c.end()), index);
  return ss.str();
}